

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  size_t sVar2;
  bool local_5a;
  FilePath local_38;
  undefined1 local_28 [8];
  FilePath parent;
  FilePath *this_local;
  
  parent.pathname_.length_ = (size_t)this;
  bVar1 = IsDirectory(this);
  if (bVar1) {
    sVar2 = String::length(&this->pathname_);
    if ((sVar2 == 0) || (bVar1 = DirectoryExists(this), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      RemoveTrailingPathSeparator(&local_38);
      RemoveFileName((FilePath *)local_28);
      ~FilePath(&local_38);
      bVar1 = CreateDirectoriesRecursively((FilePath *)local_28);
      local_5a = false;
      if (bVar1) {
        local_5a = CreateFolder(this);
      }
      this_local._7_1_ = local_5a;
      ~FilePath((FilePath *)local_28);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}